

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

void __thiscall FFT::FFTExecutor::_cleanPlans(FFTExecutor *this)

{
  if (this->_planDirect != (kiss_fftnd_cfg)0x0) {
    free(this->_planDirect);
    this->_planDirect = (kiss_fftnd_cfg)0x0;
  }
  if (this->_planInverse != (kiss_fftnd_cfg)0x0) {
    free(this->_planInverse);
    this->_planInverse = (kiss_fftnd_cfg)0x0;
  }
  return;
}

Assistant:

void FFTExecutor::_cleanPlans()
    {
        if ( _planDirect != 0 ) {
            kiss_fft_free( _planDirect );

            _planDirect = 0;
        }

        if ( _planInverse != 0 ) {
            kiss_fft_free( _planInverse );

            _planInverse = 0;
        }
    }